

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

void __thiscall irr::scene::CAnimatedMeshSceneNode::beginTransition(CAnimatedMeshSceneNode *this)

{
  u32 uVar1;
  u32 uVar2;
  IBoneSceneNode **ppIVar3;
  CMatrix4<float> *__dest;
  long in_RDI;
  f32 fVar4;
  u32 n_1;
  u32 n;
  undefined4 in_stack_ffffffffffffff48;
  eConstructor in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar5;
  undefined1 local_90 [64];
  uint local_50;
  uint local_c;
  
  if ((*(byte *)(in_RDI + 0x144) & 1) != 0) {
    if (*(int *)(in_RDI + 0x134) != 0) {
      uVar1 = core::array<irr::core::CMatrix4<float>_>::size
                        ((array<irr::core::CMatrix4<float>_> *)0x2c697d);
      uVar2 = core::array<irr::scene::IBoneSceneNode_*>::size
                        ((array<irr::scene::IBoneSceneNode_*> *)0x2c6992);
      if (uVar1 < uVar2) {
        for (local_c = core::array<irr::core::CMatrix4<float>_>::size
                                 ((array<irr::core::CMatrix4<float>_> *)0x2c69b1); uVar5 = local_c,
            uVar1 = core::array<irr::scene::IBoneSceneNode_*>::size
                              ((array<irr::scene::IBoneSceneNode_*> *)0x2c69d4), uVar5 < uVar1;
            local_c = local_c + 1) {
          core::CMatrix4<float>::CMatrix4
                    ((CMatrix4<float> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
          core::array<irr::core::CMatrix4<float>_>::push_back
                    ((array<irr::core::CMatrix4<float>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (CMatrix4<float> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        }
      }
      local_50 = 0;
      while (uVar5 = local_50,
            uVar1 = core::array<irr::scene::IBoneSceneNode_*>::size
                              ((array<irr::scene::IBoneSceneNode_*> *)0x2c6a42), uVar5 < uVar1) {
        ppIVar3 = core::array<irr::scene::IBoneSceneNode_*>::operator[]
                            ((array<irr::scene::IBoneSceneNode_*> *)
                             CONCAT44(uVar5,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
        (*((*ppIVar3)->super_ISceneNode)._vptr_ISceneNode[0xb])(local_90);
        __dest = core::array<irr::core::CMatrix4<float>_>::operator[]
                           ((array<irr::core::CMatrix4<float>_> *)
                            CONCAT44(uVar5,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
        memcpy(__dest,local_90,0x40);
        local_50 = local_50 + 1;
      }
      fVar4 = core::reciprocal((f32)(float)*(uint *)(in_RDI + 0x134));
      *(f32 *)(in_RDI + 0x138) = fVar4;
    }
    *(undefined4 *)(in_RDI + 0x13c) = 0;
  }
  return;
}

Assistant:

void CAnimatedMeshSceneNode::beginTransition()
{
	if (!JointsUsed)
		return;

	if (TransitionTime != 0) {
		// Check the array is big enough
		if (PretransitingSave.size() < JointChildSceneNodes.size()) {
			for (u32 n = PretransitingSave.size(); n < JointChildSceneNodes.size(); ++n)
				PretransitingSave.push_back(core::matrix4());
		}

		// Copy the position of joints
		for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
			PretransitingSave[n] = JointChildSceneNodes[n]->getRelativeTransformation();

		Transiting = core::reciprocal((f32)TransitionTime);
	}
	TransitingBlend = 0.f;
}